

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_Boolean
isNodeInTree(UA_NodeStore *ns,UA_NodeId *leafNode,UA_NodeId *nodeToFind,UA_NodeId *referenceTypeIds,
            size_t referenceTypeIdsSize)

{
  UA_Boolean UVar1;
  UA_Node *pUVar2;
  ulong local_50;
  size_t j;
  size_t i;
  UA_Node *node;
  size_t referenceTypeIdsSize_local;
  UA_NodeId *referenceTypeIds_local;
  UA_NodeId *nodeToFind_local;
  UA_NodeId *leafNode_local;
  UA_NodeStore *ns_local;
  
  UVar1 = UA_NodeId_equal(leafNode,nodeToFind);
  if (UVar1) {
    ns_local._7_1_ = true;
  }
  else {
    pUVar2 = UA_NodeStore_get(ns,leafNode);
    if (pUVar2 == (UA_Node *)0x0) {
      ns_local._7_1_ = false;
    }
    else {
      for (j = 0; j < pUVar2->referencesSize; j = j + 1) {
        if ((pUVar2->references[j].isInverse & 1U) != 0) {
          for (local_50 = 0; local_50 < referenceTypeIdsSize; local_50 = local_50 + 1) {
            UVar1 = UA_NodeId_equal(&pUVar2->references[j].referenceTypeId,
                                    referenceTypeIds + local_50);
            if ((UVar1) &&
               (UVar1 = isNodeInTree(ns,&pUVar2->references[j].targetId.nodeId,nodeToFind,
                                     referenceTypeIds,referenceTypeIdsSize), UVar1)) {
              return true;
            }
          }
        }
      }
      ns_local._7_1_ = false;
    }
  }
  return ns_local._7_1_;
}

Assistant:

UA_Boolean
isNodeInTree(UA_NodeStore *ns, const UA_NodeId *leafNode, const UA_NodeId *nodeToFind,
             const UA_NodeId *referenceTypeIds, size_t referenceTypeIdsSize) {
    if(UA_NodeId_equal(leafNode, nodeToFind))
        return true;

    const UA_Node *node = UA_NodeStore_get(ns,leafNode);
    if(!node)
        return false;

    /* Search upwards in the tree */
    for(size_t i = 0; i < node->referencesSize; ++i) {
        if(!node->references[i].isInverse)
            continue;

        /* Recurse only for valid reference types */
        for(size_t j = 0; j < referenceTypeIdsSize; ++j) {
            if(UA_NodeId_equal(&node->references[i].referenceTypeId, &referenceTypeIds[j]) &&
               isNodeInTree(ns, &node->references[i].targetId.nodeId, nodeToFind,
                            referenceTypeIds, referenceTypeIdsSize))
                return true;
        }
    }
    return false;
}